

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_go_to_exercise_time(tgestate_t *state)

{
  tgestate_t *in_RDI;
  
  in_RDI->bell = '(';
  queue_message(in_RDI,message_EXERCISE_TIME);
  in_RDI->locked_doors[0] = '\0';
  in_RDI->locked_doors[1] = '\x01';
  set_route_go_to_yard((tgestate_t *)0x115dbd);
  return;
}

Assistant:

static void event_go_to_exercise_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_EXERCISE_TIME);

  /* Unlock the gates. */
  state->locked_doors[0] = 0; /* Index into doors + clear locked flag. */
  state->locked_doors[1] = 1;

  set_route_go_to_yard(state);
}